

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O2

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitCallRef(InternalAnalyzer *this,CallRef *curr)

{
  EffectAnalyzer *pEVar1;
  bool bVar2;
  char cVar3;
  
  bVar2 = Type::isNull((Type *)(*(long *)(curr + 0x30) + 8));
  pEVar1 = this->parent;
  if (bVar2) {
    pEVar1->trap = true;
  }
  else {
    pEVar1->calls = true;
    if ((((pEVar1->features).features & 0x40) != 0) && (pEVar1->tryDepth == 0)) {
      pEVar1->throws_ = true;
    }
    if (curr[0x38] == (CallRef)0x1) {
      pEVar1->branchesOut = true;
    }
    cVar3 = ::wasm::Type::isNullable();
    if (cVar3 != '\0') {
      this->parent->implicitTrap = true;
    }
  }
  return;
}

Assistant:

void visitCallRef(CallRef* curr) {
      if (curr->target->type.isNull()) {
        parent.trap = true;
        return;
      }
      parent.calls = true;
      if (parent.features.hasExceptionHandling() && parent.tryDepth == 0) {
        parent.throws_ = true;
      }
      if (curr->isReturn) {
        parent.branchesOut = true;
      }
      // traps when the call target is null
      if (curr->target->type.isNullable()) {
        parent.implicitTrap = true;
      }
    }